

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

int __thiscall BamTools::ConvertTool::Run(ConvertTool *this,int argc,char **argv)

{
  bool bVar1;
  pointer pRVar2;
  undefined4 in_ESI;
  ConvertToolPrivate *in_RDI;
  int in_stack_000003c4;
  char **in_stack_000003c8;
  int in_stack_000003d4;
  ConvertToolPrivate *in_stack_000006d8;
  undefined4 in_stack_ffffffffffffffe8;
  ConvertToolPrivate *this_00;
  uint local_4;
  
  this_00 = in_RDI;
  Options::Parse(in_stack_000003d4,in_stack_000003c8,in_stack_000003c4);
  pRVar2 = (pointer)operator_new(0x130);
  ConvertToolPrivate::ConvertToolPrivate
            (this_00,(ConvertSettings *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  (in_RDI->m_references).super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
  _M_impl.super__Vector_impl_data._M_finish = pRVar2;
  bVar1 = ConvertToolPrivate::Run(in_stack_000006d8);
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int ConvertTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize ConvertTool with settings
    m_impl = new ConvertToolPrivate(m_settings);

    // run ConvertTool, return success/fail
    if (m_impl->Run()) {
        return 0;
    } else {
        return 1;
    }
}